

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.cc
# Opt level: O3

int main(int param_1,char **param_2)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  JObject *pJVar5;
  undefined1 local_80 [8];
  pthread_attr_t attrs;
  pthread_t tid;
  char local_36 [2];
  uint local_34;
  
  pthread_attr_init((pthread_attr_t *)local_80);
  pthread_attr_setscope((pthread_attr_t *)local_80,0);
  lVar4 = syscall(0xba);
  attrs._48_4_ = (int)lVar4;
  if (lwps.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
      == lwps.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              (&lwps,(iterator)
                     lwps.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish,(int *)(attrs.__size + 0x30));
  }
  else {
    *lwps.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
         (int)lVar4;
    lwps.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
         lwps.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish + 1;
  }
  attrs._48_8_ = pthread_self();
  if (threads.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      threads.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
              (&threads,(iterator)
                        threads.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_finish,
               (unsigned_long *)(attrs.__size + 0x30));
  }
  else {
    *threads.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
     super__Vector_impl_data._M_finish = attrs._48_8_;
    threads.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish =
         threads.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
  }
  local_34 = 0;
  do {
    iVar3 = pthread_create((pthread_t *)(attrs.__size + 0x30),(pthread_attr_t *)local_80,entry,
                           &local_34);
    if (iVar3 != 0) {
      __assert_fail("rc == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/peadar[P]pstack/tests/thread.cc"
                    ,0x30,"int main(int, char **)");
    }
    if (threads.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        threads.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_long,std::allocator<unsigned_long>>::
      _M_realloc_insert<unsigned_long_const&>
                ((vector<unsigned_long,std::allocator<unsigned_long>> *)&threads,
                 (iterator)
                 threads.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_finish,(unsigned_long *)(attrs.__size + 0x30));
    }
    else {
      *threads.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_finish = attrs._48_8_;
      threads.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish =
           threads.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
    }
    uVar1 = local_34 + 1;
    bVar2 = (int)local_34 < 9;
    local_34 = uVar1;
  } while (bVar2);
  pthread_mutex_lock((pthread_mutex_t *)&l);
  while (in_entry != 10) {
    pthread_cond_wait((pthread_cond_t *)&c,(pthread_mutex_t *)&l);
    pthread_mutex_unlock((pthread_mutex_t *)&l);
    pthread_mutex_lock((pthread_mutex_t *)&l);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&l);
  attrs._48_8_ = &std::cout;
  tid = (long)",\n" + 2;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"{ ",2);
  local_34 = local_34 & 0xffffff00;
  pJVar5 = pstack::JObject::
           field<char[8],std::vector<unsigned_long,std::allocator<unsigned_long>>,char>
                     ((JObject *)(attrs.__size + 0x30),(char (*) [8])"threads",&threads,
                      (char *)&local_34);
  local_36[0] = '\0';
  pJVar5 = pstack::JObject::field<char[5],std::vector<int,std::allocator<int>>,char>
                     (pJVar5,(char (*) [5])"lwps",&lwps,local_36);
  local_36[1] = 0;
  pstack::JObject::field<char[10],int,char>
            (pJVar5,(char (*) [10])"assert_at",&assertline,local_36 + 1);
  pstack::JObject::~JObject((JObject *)(attrs.__size + 0x30));
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
  std::ostream::put(-0x20);
  std::ostream::flush();
  std::ostream::flush();
  raise(7);
  return 0;
}

Assistant:

int
main(int /*unused*/, char ** /*unused*/)
{
   pthread_attr_t attrs;
   pthread_attr_init(&attrs);
   pthread_attr_setscope(&attrs, PTHREAD_SCOPE_SYSTEM);

   // the main thread will appear in the pstack output.
   lwps.push_back(syscall(SYS_gettid));
   threads.push_back(pthread_self());

   // Cretae 10 threads.
   for (int i = 0; i < 10; i++) {
      pthread_t tid;
      int rc = pthread_create(&tid, &attrs, entry, &i);
      assert(rc == 0);
      threads.push_back(tid);
   }

   // Make sure all threads have gotten to update in_entry.
   for (;;) {
      pthread_mutex_lock(&l);
      if (in_entry == 10) {
         pthread_mutex_unlock(&l);
         break;
      }
      pthread_cond_wait(&c, &l);
      pthread_mutex_unlock(&l);
   }
   {
      pstack::JObject(std::cout)
         .field("threads", threads)
         .field("lwps", lwps)
         .field("assert_at", assertline);
   }
   (std::cout << std::endl).flush();
   raise(SIGBUS);
}